

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O1

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *weights,
          double t)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  double *__ptr;
  undefined8 *puVar5;
  long lVar6;
  double *pdVar7;
  Index IVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long local_78;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_58;
  
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (knots->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_data;
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value =
       (knots->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ).
       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       .m_rows.m_value;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  compute_at_span(this,&local_58,span,t);
  free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  lVar3 = this->m_order;
  if (lVar3 < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar10 = lVar3 + 1;
  if (uVar10 != 0) {
    if (uVar10 >> 0x3d == 0) {
      __ptr = (double *)malloc(uVar10 * 8);
      if ((lVar3 != 0) && (((ulong)__ptr & 0xf) != 0)) {
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/util/Memory.h"
                      ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      if (__ptr != (double *)0x0) goto LAB_001f27be;
    }
    puVar5 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar5 = acos;
    __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __ptr = (double *)0x0;
LAB_001f27be:
  if (-1 < this->m_order) {
    lVar9 = -1;
    if (-1 < lVar3) {
      lVar9 = lVar3;
    }
    lVar11 = 0;
    do {
      if (lVar11 == lVar9 + 1) goto LAB_001f29e3;
      __ptr[lVar11] = 0.0;
      if (-1 < this->m_degree) {
        lVar12 = 0;
        do {
          lVar6 = this->m_first_nonzero_pole + lVar12;
          if ((lVar6 < 0) ||
             ((weights->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
              .m_rows.m_value <= lVar6)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xb4,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                         );
          }
          dVar1 = (weights->
                  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                  .m_data[lVar6];
          pdVar7 = value(this,lVar11,lVar12);
          *pdVar7 = dVar1 * *pdVar7;
          pdVar7 = value(this,lVar11,lVar12);
          __ptr[lVar11] = *pdVar7 + __ptr[lVar11];
          bVar4 = lVar12 < this->m_degree;
          lVar12 = lVar12 + 1;
        } while (bVar4);
      }
      bVar4 = lVar11 < this->m_order;
      lVar11 = lVar11 + 1;
    } while (bVar4);
  }
  if (-1 < this->m_order) {
    lVar9 = 0;
    if (0 < lVar3) {
      lVar9 = lVar3;
    }
    local_78 = 1;
    lVar11 = 0;
    do {
      if (lVar11 != 0) {
        lVar12 = 1;
        do {
          IVar8 = Math::binom(lVar11,lVar12);
          if (lVar12 == lVar9 + 1) goto LAB_001f29e3;
          if (-1 < this->m_degree) {
            dVar1 = __ptr[lVar12];
            lVar6 = -1;
            do {
              lVar6 = lVar6 + 1;
              pdVar7 = value(this,lVar11 - lVar12,lVar6);
              dVar2 = *pdVar7;
              pdVar7 = value(this,lVar11,lVar6);
              *pdVar7 = dVar2 * -dVar1 * (double)IVar8 + *pdVar7;
            } while (lVar6 < this->m_degree);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != local_78);
      }
      if (-1 < this->m_degree) {
        if (lVar3 < 0) {
LAB_001f29e3:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x198,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        lVar12 = -1;
        do {
          lVar12 = lVar12 + 1;
          dVar1 = *__ptr;
          pdVar7 = value(this,lVar11,lVar12);
          *pdVar7 = *pdVar7 / dVar1;
        } while (lVar12 < this->m_degree);
      }
      local_78 = local_78 + 1;
      bVar4 = lVar11 < this->m_order;
      lVar11 = lVar11 + 1;
    } while (bVar4);
  }
  free(__ptr);
  return;
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, Eigen::Ref<const Eigen::VectorXd> weights, const double t)
    {
        using Math::binom;

        // compute B-Spline shape

        compute_at_span(knots, span, t);

        // compute weighted sum

        Eigen::VectorXd weighted_sums(nb_shapes());

        for (Index k = 0; k < nb_shapes(); k++) {
            weighted_sums[k] = 0;

            for (Index i = 0; i < nb_nonzero_poles(); i++) {
                value(k, i) *= weights(m_first_nonzero_pole + i);
                weighted_sums[k] += value(k, i);
            }
        }

        for (Index k = 0; k < nb_shapes(); k++) {
            for (Index i = 1; i <= k; i++) {
                const double a = binom(k, i) * weighted_sums[i];

                for (Index p = 0; p < nb_nonzero_poles(); p++) {
                    value(k, p) -= a * value(k - i, p);
                }
            }

            for (Index p = 0; p < nb_nonzero_poles(); p++) {
                value(k, p) /= weighted_sums[0];
            }
        }
    }